

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *pPVar2;
  int iVar3;
  MethodDescriptor *method_00;
  Options *pOVar4;
  string_view local_98 [2];
  Options local_78;
  MethodDescriptor *local_28;
  MethodDescriptor *method;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  method._4_4_ = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = method._4_4_;
    iVar3 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar3 <= iVar1) break;
    method_00 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method._4_4_);
    pPVar2 = pPStack_18;
    local_28 = method_00;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_78,pOVar4);
    WriteMethodDocComment(pPVar2,method_00,&local_78);
    Options::~Options(&local_78);
    GenerateMethodSignature(this,pPStack_18,local_28,IS_ABSTRACT);
    pPVar2 = pPStack_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,";\n\n");
    protobuf::io::Printer::Print<>(pPVar2,local_98[0]);
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method, context_->options());
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}